

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O0

bool __thiscall IntVarSL::setVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  uint uVar2;
  undefined1 in_CL;
  undefined8 in_RDX;
  Tint *in_RSI;
  IntVarSL *in_RDI;
  SAT *unaff_retaddr;
  Reason in_stack_00000008;
  Lit in_stack_00000014;
  int u;
  undefined3 in_stack_ffffffffffffffdc;
  uint o;
  bool local_1;
  
  o = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  iVar1 = find_index(in_RDI,(int)((ulong)in_RSI >> 0x20),(RoundMode)in_RSI);
  if (iVar1 == -1) {
    if ((o & 0x1000000) != 0) {
      SAT::cEnqueue(unaff_retaddr,in_stack_00000014,in_stack_00000008);
    }
    local_1 = false;
  }
  else {
    uVar2 = (*(in_RDI->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x10])
                      (in_RDI->el,(long)iVar1,in_RDX,(ulong)((byte)(o >> 0x18) & 1));
    if ((uVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      iVar1 = Tint::operator_cast_to_int(&(in_RDI->super_IntVar).min);
      if ((long)iVar1 < (long)in_RSI) {
        Tint::operator=(in_RSI,o);
      }
      iVar1 = Tint::operator_cast_to_int(&(in_RDI->super_IntVar).max);
      if ((long)in_RSI < (long)iVar1) {
        Tint::operator=(in_RSI,o);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool IntVarSL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	if (u == -1) {
		if (channel) {
			sat.cEnqueue(lit_False, r);
		}
		assert(sat.confl);
		return false;
	}
	if (!el->setVal(u, r, channel)) {
		return false;
	}
	if (min < v) {
		min = static_cast<int>(v);
	}
	if (max > v) {
		max = static_cast<int>(v);
	}
	return true;
}